

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# midi2melody.cpp
# Opt level: O1

int notecompare(void *a,void *b)

{
  int iVar1;
  
  iVar1 = -1;
  if ((*b <= *a) && (iVar1 = 1, *a <= *b)) {
    if (*(int *)((long)a + 0x10) <= *(int *)((long)b + 0x10)) {
      iVar1 = -(uint)(*(int *)((long)a + 0x10) < *(int *)((long)b + 0x10));
    }
  }
  return iVar1;
}

Assistant:

int notecompare(const void* a, const void* b) {
	const Melody& aa = *static_cast<const Melody*>(a);
	const Melody& bb = *static_cast<const Melody*>(b);

	if (aa.tick < bb.tick) {
		return -1;
	} else if (aa.tick > bb.tick) {
		return 1;
	} else {
		// highest note comes first
		if (aa.pitch > bb.pitch) {
			return 1;
		} else if (aa.pitch < bb.pitch) {
			return -1;
		} else {
			return 0;
		}
	}
}